

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorydata.cpp
# Opt level: O0

int __thiscall ncnn::MemoryData::load_model(MemoryData *this,ModelBin *mb)

{
  bool bVar1;
  long *in_RSI;
  size_t in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  Mat *in_stack_ffffffffffffff00;
  Mat *in_stack_ffffffffffffff08;
  Mat *this_00;
  undefined1 local_e8 [4];
  int in_stack_ffffffffffffff1c;
  Mat *in_stack_ffffffffffffff20;
  Mat local_a8;
  Mat local_58;
  int local_4;
  
  if (*(int *)(in_RDI + 0xc0) == 0) {
    if (*(int *)(in_RDI + 0xbc) == 0) {
      if (*(int *)(in_RDI + 0xb8) == 0) {
        Mat::create(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_RDI,
                    (Allocator *)in_stack_ffffffffffffff08);
      }
      else {
        (**(code **)(*in_RSI + 0x10))
                  (local_e8,in_RSI,*(undefined4 *)(in_RDI + 0xb8),1,in_R8,in_R9,local_e8);
        Mat::operator=(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
        Mat::~Mat((Mat *)0x151730);
      }
    }
    else {
      in_stack_ffffffffffffff00 = &local_a8;
      (**(code **)(*in_RSI + 0x18))
                (in_stack_ffffffffffffff00,in_RSI,*(undefined4 *)(in_RDI + 0xb8),
                 *(undefined4 *)(in_RDI + 0xbc),1);
      Mat::operator=(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
      Mat::~Mat((Mat *)0x1516af);
    }
  }
  else {
    this_00 = &local_58;
    (**(code **)(*in_RSI + 0x20))
              (this_00,in_RSI,*(undefined4 *)(in_RDI + 0xb8),*(undefined4 *)(in_RDI + 0xbc),
               *(undefined4 *)(in_RDI + 0xc0),1);
    Mat::operator=(this_00,in_stack_ffffffffffffff00);
    Mat::~Mat((Mat *)0x151622);
  }
  bVar1 = Mat::empty(in_stack_ffffffffffffff00);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int MemoryData::load_model(const ModelBin& mb)
{
    if (c != 0)
    {
        data = mb.load(w, h, c, 1);
    }
    else if (h != 0)
    {
        data = mb.load(w, h, 1);
    }
    else if (w != 0)
    {
        data = mb.load(w, 1);
    }
    else // 0 0 0
    {
        data.create(1);
    }
    if (data.empty())
        return -100;

    return 0;
}